

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_serialize.c
# Opt level: O0

void lj_serialize_dict_prep_str(lua_State *L,GCtab *dict)

{
  int iVar1;
  MSize MVar2;
  cTValue *key;
  cTValue *pcVar3;
  TValue TVar4;
  TValue *pTVar5;
  bool bVar6;
  uint32_t local_48;
  uint32_t local_44;
  cTValue *o;
  MSize len;
  MSize i;
  GCtab *dict_local;
  lua_State *L_local;
  
  if ((dict->hmask == 0) && (MVar2 = lj_tab_len(dict), MVar2 != 0)) {
    if (MVar2 == 0) {
      local_48 = 0;
    }
    else {
      if (MVar2 == 1) {
        local_44 = 1;
      }
      else {
        iVar1 = 0x1f;
        if (MVar2 - 1 != 0) {
          for (; MVar2 - 1 >> iVar1 == 0; iVar1 = iVar1 + -1) {
          }
        }
        local_44 = iVar1 + 1;
      }
      local_48 = local_44;
    }
    lj_tab_resize(L,dict,dict->asize,local_48);
    o._4_4_ = 1;
    while( true ) {
      bVar6 = false;
      if (o._4_4_ <= MVar2) {
        bVar6 = o._4_4_ < dict->asize;
      }
      if (!bVar6) break;
      key = (cTValue *)((dict->array).ptr64 + (ulong)o._4_4_ * 8);
      if ((int)(key->field_4).it >> 0xf == -5) {
        pcVar3 = lj_tab_getstr(dict,(GCstr *)(key->u64 & 0x7fffffffffff));
        if (pcVar3 == (cTValue *)0x0) {
          TVar4._0_4_ = o._4_4_ - 1;
          TVar4.field_4.it = 0;
          pTVar5 = lj_tab_newkey(L,dict,key);
          *pTVar5 = TVar4;
        }
      }
      else if ((int)(key->field_4).it >> 0xf != -2) {
        lj_err_caller(L,LJ_ERR_BUFFER_BADOPT);
      }
      o._4_4_ = o._4_4_ + 1;
    }
  }
  return;
}

Assistant:

void LJ_FASTCALL lj_serialize_dict_prep_str(lua_State *L, GCtab *dict)
{
  if (!dict->hmask) {  /* No hash part means not prepared, yet. */
    MSize i, len = lj_tab_len(dict);
    if (!len) return;
    lj_tab_resize(L, dict, dict->asize, hsize2hbits(len));
    for (i = 1; i <= len && i < dict->asize; i++) {
      cTValue *o = arrayslot(dict, i);
      if (tvisstr(o)) {
	if (!lj_tab_getstr(dict, strV(o))) {  /* Ignore dups. */
	  lj_tab_newkey(L, dict, o)->u64 = (uint64_t)(i-1);
	}
      } else if (!tvisfalse(o)) {
	lj_err_caller(L, LJ_ERR_BUFFER_BADOPT);
      }
    }
  }
}